

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_callmsg.c
# Opt level: O1

_Bool xdr_call_encode(XDR *xdrs,rpc_msg *cmsg)

{
  uint uVar1;
  uint uVar2;
  msg_type mVar3;
  _Bool _Var4;
  uint8_t *puVar5;
  ulong uVar6;
  undefined8 uVar7;
  char *pcVar8;
  uint *puVar9;
  
  uVar1 = (cmsg->cb_cred).oa_length;
  if (400 < uVar1) {
    if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
      return false;
    }
    pcVar8 = "%s:%u ERROR cb_cred.oa_length (%u) > %u";
    uVar7 = 0x41;
    uVar2 = uVar1;
LAB_001116da:
    (*__ntirpc_pkg_params.warnx_)(pcVar8,"xdr_call_encode",uVar7,(ulong)uVar2,400);
    return false;
  }
  uVar2 = (cmsg->cb_verf).oa_length;
  if (400 < uVar2) {
    if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
      return false;
    }
    pcVar8 = "%s:%u ERROR cb_verf.oa_length (%u) > %u";
    uVar7 = 0x49;
    goto LAB_001116da;
  }
  puVar9 = (uint *)xdrs->x_data;
  puVar5 = (uint8_t *)((long)puVar9 + (ulong)((uVar2 + 3 & 0x3fc) + (uVar1 + 3 & 0x3fc)) + 0x28);
  if ((xdrs->x_v).vio_wrap < puVar5) {
    puVar9 = (uint *)0x0;
  }
  else {
    xdrs->x_data = puVar5;
    if ((xdrs->x_v).vio_tail < puVar5) {
      (xdrs->x_v).vio_tail = puVar5;
      *(uint8_t **)((long)xdrs->x_base + 0x10) = puVar5;
    }
  }
  if (puVar9 != (uint *)0x0) {
    if ((__ntirpc_pkg_params.debug_flags >> 0x19 & 1) != 0) {
      (*__ntirpc_pkg_params.warnx_)("%s:%u INLINE","xdr_call_encode",0x55);
    }
    uVar1 = cmsg->rm_xid;
    *puVar9 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    mVar3 = cmsg->rm_direction;
    puVar9[1] = mVar3 >> 0x18 | (mVar3 & 0xff0000) >> 8 | (mVar3 & 0xff00) << 8 | mVar3 << 0x18;
    uVar1 = (cmsg->ru).RM_cmb.cb_rpcvers;
    puVar9[2] = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    uVar1 = (cmsg->ru).RM_cmb.cb_rpcvers;
    if (uVar1 == 2) {
      uVar1 = cmsg->cb_prog;
      puVar9[3] = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      uVar1 = cmsg->cb_vers;
      puVar9[4] = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      uVar1 = cmsg->cb_proc;
      puVar9[5] = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      uVar1 = (cmsg->cb_cred).oa_flavor;
      puVar9[6] = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      uVar1 = (cmsg->cb_cred).oa_length;
      puVar9[7] = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      puVar9 = puVar9 + 8;
      uVar6 = (ulong)(cmsg->cb_cred).oa_length;
      if (uVar6 != 0) {
        memcpy(puVar9,(cmsg->cb_cred).oa_body,uVar6);
        puVar9 = (uint *)((long)puVar9 + (ulong)((cmsg->cb_cred).oa_length + 3 & 0xfffffffc));
      }
      uVar1 = (cmsg->cb_verf).oa_flavor;
      *puVar9 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      uVar1 = (cmsg->cb_verf).oa_length;
      puVar9[1] = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      uVar6 = (ulong)(cmsg->cb_verf).oa_length;
      if (uVar6 == 0) {
        return true;
      }
      memcpy(puVar9 + 2,(cmsg->cb_verf).oa_body,uVar6);
      return true;
    }
    if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
      return false;
    }
    uVar7 = 0x5c;
LAB_00111a20:
    (*__ntirpc_pkg_params.warnx_)
              ("%s:%u ERROR rm_call.cb_rpcvers %u != %u","xdr_call_encode",uVar7,(ulong)uVar1,2);
    return false;
  }
  if ((__ntirpc_pkg_params.debug_flags >> 0x19 & 1) != 0) {
    (*__ntirpc_pkg_params.warnx_)("%s:%u non-INLINE","xdr_call_encode",0x78);
  }
  uVar1 = cmsg->rm_xid;
  puVar9 = (uint *)((long)xdrs->x_data + 4);
  if ((xdrs->x_v).vio_wrap < puVar9) {
    _Var4 = (*xdrs->x_ops->x_putunit)(xdrs,uVar1);
    if (!_Var4) {
      if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
        return false;
      }
      uVar6 = (ulong)cmsg->rm_xid;
      pcVar8 = "%s:%u ERROR rm_xid %u";
      uVar7 = 0x7c;
      goto LAB_00111a7e;
    }
  }
  else {
    *(uint *)xdrs->x_data =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    xdrs->x_data = (uint8_t *)puVar9;
  }
  mVar3 = cmsg->rm_direction;
  puVar9 = (uint *)((long)xdrs->x_data + 4);
  if ((xdrs->x_v).vio_wrap < puVar9) {
    _Var4 = (*xdrs->x_ops->x_putunit)(xdrs,mVar3);
    if (!_Var4) {
      if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
        return false;
      }
      uVar6 = (ulong)cmsg->rm_direction;
      pcVar8 = "%s:%u ERROR rm_direction %u";
      uVar7 = 0x83;
      goto LAB_00111a7e;
    }
  }
  else {
    *(msg_type *)xdrs->x_data =
         mVar3 >> 0x18 | (mVar3 & 0xff0000) >> 8 | (mVar3 & 0xff00) << 8 | mVar3 << 0x18;
    xdrs->x_data = (uint8_t *)puVar9;
  }
  uVar1 = (cmsg->ru).RM_cmb.cb_rpcvers;
  puVar9 = (uint *)((long)xdrs->x_data + 4);
  if ((xdrs->x_v).vio_wrap < puVar9) {
    _Var4 = (*xdrs->x_ops->x_putunit)(xdrs,uVar1);
    if (!_Var4) {
      if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
        return false;
      }
      uVar6 = (ulong)(cmsg->ru).RM_cmb.cb_rpcvers;
      pcVar8 = "%s:%u ERROR rm_call.cb_rpcvers %u";
      uVar7 = 0x8a;
      goto LAB_00111a7e;
    }
  }
  else {
    *(uint *)xdrs->x_data =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    xdrs->x_data = (uint8_t *)puVar9;
  }
  uVar1 = (cmsg->ru).RM_cmb.cb_rpcvers;
  if (uVar1 != 2) {
    if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
      return false;
    }
    uVar7 = 0x91;
    goto LAB_00111a20;
  }
  uVar1 = cmsg->cb_prog;
  puVar9 = (uint *)((long)xdrs->x_data + 4);
  if ((xdrs->x_v).vio_wrap < puVar9) {
    _Var4 = (*xdrs->x_ops->x_putunit)(xdrs,uVar1);
    if (!_Var4) {
      if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
        return false;
      }
      uVar6 = (ulong)cmsg->cb_prog;
      pcVar8 = "%s:%u ERROR cb_prog %u";
      uVar7 = 0x99;
      goto LAB_00111a7e;
    }
  }
  else {
    *(uint *)xdrs->x_data =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    xdrs->x_data = (uint8_t *)puVar9;
  }
  uVar1 = cmsg->cb_vers;
  puVar9 = (uint *)((long)xdrs->x_data + 4);
  if ((xdrs->x_v).vio_wrap < puVar9) {
    _Var4 = (*xdrs->x_ops->x_putunit)(xdrs,uVar1);
    if (!_Var4) {
      if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
        return false;
      }
      uVar6 = (ulong)cmsg->cb_vers;
      pcVar8 = "%s:%u ERROR cb_vers %u";
      uVar7 = 0xa0;
      goto LAB_00111a7e;
    }
  }
  else {
    *(uint *)xdrs->x_data =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    xdrs->x_data = (uint8_t *)puVar9;
  }
  uVar1 = cmsg->cb_proc;
  puVar9 = (uint *)((long)xdrs->x_data + 4);
  if ((xdrs->x_v).vio_wrap < puVar9) {
    _Var4 = (*xdrs->x_ops->x_putunit)(xdrs,uVar1);
    if (!_Var4) {
      if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
        return false;
      }
      uVar6 = (ulong)cmsg->cb_proc;
      pcVar8 = "%s:%u ERROR cb_proc %u";
      uVar7 = 0xa7;
LAB_00111a7e:
      (*__ntirpc_pkg_params.warnx_)(pcVar8,"xdr_call_encode",uVar7,uVar6);
      return false;
    }
  }
  else {
    *(uint *)xdrs->x_data =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    xdrs->x_data = (uint8_t *)puVar9;
  }
  _Var4 = xdr_opaque_auth_encode(xdrs,&cmsg->cb_cred);
  if (_Var4) {
    _Var4 = xdr_opaque_auth_encode(xdrs,&cmsg->cb_verf);
    if (_Var4) {
      return true;
    }
    if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
      return false;
    }
    uVar7 = 0xb4;
  }
  else {
    if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
      return false;
    }
    uVar7 = 0xae;
  }
  (*__ntirpc_pkg_params.warnx_)("%s:%u ERROR (return)","xdr_call_encode",uVar7);
  return false;
}

Assistant:

bool
xdr_call_encode(XDR *xdrs, struct rpc_msg *cmsg)
{
	struct opaque_auth *oa;
	int32_t *buf;

	if (cmsg->cb_cred.oa_length > MAX_AUTH_BYTES) {
		__warnx(TIRPC_DEBUG_FLAG_ERROR,
			"%s:%u ERROR cb_cred.oa_length (%u) > %u",
			__func__, __LINE__,
			cmsg->cb_cred.oa_length,
			MAX_AUTH_BYTES);
		return (false);
	}
	if (cmsg->cb_verf.oa_length > MAX_AUTH_BYTES) {
		__warnx(TIRPC_DEBUG_FLAG_ERROR,
			"%s:%u ERROR cb_verf.oa_length (%u) > %u",
			__func__, __LINE__,
			cmsg->cb_verf.oa_length,
			MAX_AUTH_BYTES);
		return (false);
	}
	buf = xdr_inline_encode(xdrs, 8 * BYTES_PER_XDR_UNIT
					+ RNDUP(cmsg->cb_cred.oa_length)
					+ 2 * BYTES_PER_XDR_UNIT
					+ RNDUP(cmsg->cb_verf.oa_length));
	if (buf != NULL) {
		__warnx(TIRPC_DEBUG_FLAG_RPC_MSG,
			"%s:%u INLINE",
			__func__, __LINE__);
		IXDR_PUT_INT32(buf, cmsg->rm_xid);
		IXDR_PUT_ENUM(buf, cmsg->rm_direction);
		IXDR_PUT_INT32(buf, cmsg->rm_call.cb_rpcvers);
		if (cmsg->rm_call.cb_rpcvers != RPC_MSG_VERSION) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR rm_call.cb_rpcvers %u != %u",
				__func__, __LINE__,
				cmsg->rm_call.cb_rpcvers,
				RPC_MSG_VERSION);
			return (false);
		}
		IXDR_PUT_INT32(buf, cmsg->cb_prog);
		IXDR_PUT_INT32(buf, cmsg->cb_vers);
		IXDR_PUT_INT32(buf, cmsg->cb_proc);
		oa = &cmsg->cb_cred;
		IXDR_PUT_ENUM(buf, oa->oa_flavor);
		IXDR_PUT_INT32(buf, oa->oa_length);
		if (oa->oa_length) {
			memcpy(buf, oa->oa_body, oa->oa_length);
			buf += RNDUP(oa->oa_length) / sizeof (int32_t);
		}
		oa = &cmsg->cb_verf;
		IXDR_PUT_ENUM(buf, oa->oa_flavor);
		IXDR_PUT_INT32(buf, oa->oa_length);
		if (oa->oa_length) {
			memcpy(buf, oa->oa_body, oa->oa_length);
			/* no real need....
			buf += RNDUP(oa->oa_length) / sizeof (int32_t);
			*/
		}
	} else {
		/* nTI-RPC handles multiple buffers */
		__warnx(TIRPC_DEBUG_FLAG_RPC_MSG,
			"%s:%u non-INLINE",
			__func__, __LINE__);
		if (!xdr_putuint32(xdrs, cmsg->rm_xid)) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR rm_xid %u",
				__func__, __LINE__,
				cmsg->rm_xid);
			return (false);
		}
		if (!xdr_putenum(xdrs, cmsg->rm_direction)) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR rm_direction %u",
				__func__, __LINE__,
				cmsg->rm_direction);
			return (false);
		}
		if (!xdr_putuint32(xdrs, cmsg->rm_call.cb_rpcvers)) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR rm_call.cb_rpcvers %u",
				__func__, __LINE__,
				cmsg->rm_call.cb_rpcvers);
			return (false);
		}
		if (cmsg->rm_call.cb_rpcvers != RPC_MSG_VERSION) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR rm_call.cb_rpcvers %u != %u",
				__func__, __LINE__,
				cmsg->rm_call.cb_rpcvers,
				RPC_MSG_VERSION);
			return (false);
		}
		if (!xdr_putuint32(xdrs, cmsg->cb_prog)) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR cb_prog %u",
				__func__, __LINE__,
				cmsg->cb_prog);
			return (false);
		}
		if (!xdr_putuint32(xdrs, cmsg->cb_vers)) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR cb_vers %u",
				__func__, __LINE__,
				cmsg->cb_vers);
			return (false);
		}
		if (!xdr_putuint32(xdrs, cmsg->cb_proc)) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR cb_proc %u",
				__func__, __LINE__,
				cmsg->cb_proc);
			return (false);
		}
		if (!xdr_opaque_auth_encode(xdrs, &(cmsg->cb_cred))) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR (return)",
				__func__, __LINE__);
			return (false);
		}
		if (!xdr_opaque_auth_encode(xdrs, &(cmsg->cb_verf))) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR (return)",
				__func__, __LINE__);
			return (false);
		}
	}
	return (true);
}